

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
nonstd::sv_lite::to_string<char,std::char_traits<char>,std::allocator<char>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,sv_lite *this,basic_string_view<char,_std::char_traits<char>_> *v,allocator<char> *a)

{
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_30,*(long *)this,*(long *)(this + 8) + *(long *)this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_30);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT, Traits, Allocator>
to_string( basic_string_view<CharT, Traits> v, Allocator const & a )
{
    return std::basic_string<CharT, Traits, Allocator>( v.begin(), v.end(), a );
}